

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O2

string * __thiscall
CLI::detail::
generate_set<std::map<std::__cxx11::string,(anonymous_namespace)::C_A_T_C_H_T_E_S_T_12::test()::tstruct,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,(anonymous_namespace)::C_A_T_C_H_T_E_S_T_12::test()::tstruct>>>>
          (string *__return_storage_ptr__,detail *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tstruct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tstruct>_>_>
          *set)

{
  string *psVar1;
  long lVar2;
  long lVar3;
  _Rb_tree_node_base *p_Var4;
  _Self __tmp;
  _Rb_tree_node_base *p_Var5;
  allocator local_211;
  string *local_210;
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  ostringstream s;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  local_210 = __return_storage_ptr__;
  ::std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x01');
  ::std::__cxx11::string::string(local_208,",",&local_211);
  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
  p_Var5 = *(_Rb_tree_node_base **)(this + 0x18);
  lVar2 = ::std::ostream::tellp();
  while (p_Var5 != (_Rb_tree_node_base *)(this + 8)) {
    lVar3 = ::std::ostream::tellp();
    if (lVar2 < lVar3) {
      ::std::operator<<((ostream *)&s,local_208);
      lVar2 = lVar3;
    }
    p_Var4 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var5);
    ::std::__cxx11::string::string(local_1c8,(string *)(p_Var5 + 1));
    ::std::operator<<((ostream *)&s,local_1c8);
    ::std::__cxx11::string::~string(local_1c8);
    p_Var5 = p_Var4;
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
  psVar1 = local_210;
  ::std::__cxx11::string::append((string *)local_210);
  ::std::__cxx11::string::~string(local_1e8);
  ::std::__cxx11::string::~string(local_208);
  ::std::__cxx11::string::push_back((char)psVar1);
  return psVar1;
}

Assistant:

std::string generate_set(const T &set) {
    using element_t = typename detail::element_type<T>::type;
    using iteration_type_t = typename detail::pair_adaptor<element_t>::value_type;  // the type of the object pair
    std::string out(1, '{');
    out.append(detail::join(
        detail::smart_deref(set),
        [](const iteration_type_t &v) { return detail::pair_adaptor<element_t>::first(v); },
        ","));
    out.push_back('}');
    return out;
}